

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

bool __thiscall
rsg::anon_unknown_0::IsWritableIntersectingEntry::operator()
          (IsWritableIntersectingEntry *this,ValueEntry *entry)

{
  Storage SVar1;
  bool bVar2;
  ConstValueRangeAccess local_28;
  
  SVar1 = entry->m_variable->m_storage;
  if (((SVar1 < STORAGE_LAST) && ((0xe5U >> (SVar1 & 0x1f) & 1) != 0)) &&
     (bVar2 = VariableType::operator==(&entry->m_variable->m_type,(this->m_valueRange).m_type),
     bVar2)) {
    local_28.m_type = &(entry->m_valueRange).m_type;
    local_28.m_min =
         (entry->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_28.m_max =
         (entry->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (local_28.m_min ==
        (entry->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_28.m_min = (pointer)0x0;
    }
    if (local_28.m_max ==
        (entry->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_28.m_max = (pointer)0x0;
    }
    bVar2 = ConstValueRangeAccess::intersects(&local_28,&this->m_valueRange);
    return bVar2;
  }
  return false;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		return IsWritableEntry::operator()(entry) &&
			   entry->getVariable()->getType() == m_valueRange.getType() &&
			   entry->getValueRange().intersects(m_valueRange);
	}